

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::basic_symbol<tchecker::parsing::system::parser_t::by_state>::
move(basic_symbol<tchecker::parsing::system::parser_t::by_state> *this,
    basic_symbol<tchecker::parsing::system::parser_t::by_state> *s)

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  int iVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  shared_ptr<tchecker::parsing::attr_t> *u_00;
  shared_ptr<tchecker::parsing::sync_constraint_t> *u_01;
  
  (this->super_by_state).state = (s->super_by_state).state;
  (s->super_by_state).state = '\0';
  lVar7 = (long)(this->super_by_state).state;
  if (lVar7 == 0) {
    iVar6 = -2;
  }
  else {
    iVar6 = (int)(char)yystos_[lVar7];
  }
  switch(iVar6) {
  case 0xc:
  case 0xe:
  case 0x13:
  case 0x1d:
    u = value_type::as<std::__cxx11::string>(&s->value);
    value_type::emplace<std::__cxx11::string,std::__cxx11::string>(&this->value,u);
    value_type::destroy<std::__cxx11::string>(&s->value);
    break;
  case 0x1a:
  case 0x1b:
    value_type::move<tchecker::parsing::attributes_t>(&this->value,&s->value);
    break;
  case 0x1c:
    u_00 = value_type::as<std::shared_ptr<tchecker::parsing::attr_t>>(&s->value);
    value_type::
    emplace<std::shared_ptr<tchecker::parsing::attr_t>,std::shared_ptr<tchecker::parsing::attr_t>>
              (&this->value,u_00);
    value_type::destroy<std::shared_ptr<tchecker::parsing::attr_t>>(&s->value);
    break;
  case 0x1e:
    value_type::
    move<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
              (&this->value,&s->value);
    break;
  case 0x1f:
    u_01 = value_type::as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(&s->value);
    value_type::
    emplace<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::shared_ptr<tchecker::parsing::sync_constraint_t>>
              (&this->value,u_01);
    value_type::destroy<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(&s->value);
    break;
  case 0x20:
    value_type::move<tchecker::sync_strength_t>(&this->value,&s->value);
    break;
  case 0x23:
    value_type::move<int>(&this->value,&s->value);
    break;
  case 0x24:
    value_type::move<unsigned_int>(&this->value,&s->value);
  }
  pfVar1 = (s->location).begin.filename;
  cVar4 = (s->location).begin.line;
  cVar5 = (s->location).begin.column;
  cVar2 = (s->location).end.line;
  cVar3 = (s->location).end.column;
  (this->location).end.filename = (s->location).end.filename;
  (this->location).end.line = cVar2;
  (this->location).end.column = cVar3;
  (this->location).begin.filename = pfVar1;
  (this->location).begin.line = cVar4;
  (this->location).begin.column = cVar5;
  return;
}

Assistant:

void
  parser_t::basic_symbol<Base>::move (basic_symbol& s)
  {
    super_type::move (s);
    switch (this->kind ())
    {
      case symbol_kind::S_sync_strength: // sync_strength
        value.move< enum tchecker::sync_strength_t > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_attr: // attr
        value.move< std::shared_ptr<tchecker::parsing::attr_t> > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
        value.move< std::shared_ptr<tchecker::parsing::sync_constraint_t> > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer value"
      case symbol_kind::S_TOK_TEXT: // "text value"
      case symbol_kind::S_text_or_empty: // text_or_empty
        value.move< std::string > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
        value.move< std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_integer: // integer
        value.move< tchecker::integer_t > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_attr_list: // attr_list
      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
        value.move< tchecker::parsing::attributes_t > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_uinteger: // uinteger
        value.move< unsigned int > (YY_MOVE (s.value));
        break;

      default:
        break;
    }

    location = YY_MOVE (s.location);
  }